

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Gia_ObjFanin1CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  
  if (vCarries != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntEntry(vCarries,Id - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (iVar1 != -1) {
      iVar1 = Vec_IntEntry(vCarries,Id - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar1 = Abc_LitNotCond(iVar1,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
      return iVar1;
    }
  }
  iVar1 = Gia_ObjFanin1Copy(pObj);
  return iVar1;
}

Assistant:

int Gia_ObjFanin1CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId1(pObj, Id)) == -1 )
        return Gia_ObjFanin1Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId1(pObj, Id)), Gia_ObjFaninC1(pObj) );
}